

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int up_scale_image(uchar *orig,int width,int height,int channels,uchar *resampled,
                  int resampled_width,int resampled_height)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  iVar4 = 0;
  iVar9 = 0;
  if ((((resampled != (uchar *)0x0) && (iVar9 = 0, orig != (uchar *)0x0)) &&
      (iVar9 = iVar4, 0 < channels)) &&
     (((0 < width && (0 < height)) && ((1 < resampled_width && (1 < resampled_height)))))) {
    uVar8 = (ulong)(uint)channels;
    uVar10 = 0;
    do {
      fVar11 = (float)(int)uVar10 * (((float)height + -1.0) / ((float)resampled_height + -1.0));
      iVar9 = (int)fVar11;
      if (height + -2 < iVar9) {
        iVar9 = height + -2;
      }
      fVar11 = fVar11 - (float)iVar9;
      uVar6 = 0;
      do {
        fVar12 = (float)(int)uVar6 * (((float)width + -1.0) / ((float)resampled_width + -1.0));
        iVar4 = (int)fVar12;
        if (width + -2 < iVar4) {
          iVar4 = width + -2;
        }
        fVar12 = fVar12 - (float)iVar4;
        lVar7 = (long)((iVar4 + iVar9 * width) * channels);
        uVar5 = 0;
        do {
          pbVar1 = orig + lVar7;
          lVar3 = lVar7 + uVar8;
          lVar2 = lVar7 + channels * width;
          lVar7 = lVar7 + 1;
          resampled[uVar5 + (long)(((int)uVar6 + (int)uVar10 * resampled_width) * channels)] =
               (uchar)(int)((float)orig[lVar2 + uVar8] * fVar12 * fVar11 +
                           (float)orig[lVar2] * (1.0 - fVar12) * fVar11 +
                           (float)orig[lVar3] * fVar12 * (1.0 - fVar11) +
                           (float)*pbVar1 * (1.0 - fVar12) * (1.0 - fVar11) + 0.5);
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar8);
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)resampled_width);
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)resampled_height);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int
	up_scale_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int resampled_width, int resampled_height
	)
{
	float dx, dy;
	int x, y, c;

    /* error(s) check	*/
    if ( 	(width < 1) || (height < 1) ||
            (resampled_width < 2) || (resampled_height < 2) ||
            (channels < 1) ||
            (NULL == orig) || (NULL == resampled) )
    {
        /*	signify badness	*/
        return 0;
    }
    /*
		for each given pixel in the new map, find the exact location
		from the original map which would contribute to this guy
	*/
    dx = (width - 1.0f) / (resampled_width - 1.0f);
    dy = (height - 1.0f) / (resampled_height - 1.0f);
    for ( y = 0; y < resampled_height; ++y )
    {
    	/* find the base y index and fractional offset from that	*/
    	float sampley = y * dy;
    	int inty = (int)sampley;
    	/*	if( inty < 0 ) { inty = 0; } else	*/
		if( inty > height - 2 ) { inty = height - 2; }
		sampley -= inty;
        for ( x = 0; x < resampled_width; ++x )
        {
			float samplex = x * dx;
			int intx = (int)samplex;
			int base_index;
			/* find the base x index and fractional offset from that	*/
			/*	if( intx < 0 ) { intx = 0; } else	*/
			if( intx > width - 2 ) { intx = width - 2; }
			samplex -= intx;
			/*	base index into the original image	*/
			base_index = (inty * width + intx) * channels;
            for ( c = 0; c < channels; ++c )
            {
            	/*	do the sampling	*/
				float value = 0.5f;
				value += orig[base_index]
							*(1.0f-samplex)*(1.0f-sampley);
				value += orig[base_index+channels]
							*(samplex)*(1.0f-sampley);
				value += orig[base_index+width*channels]
							*(1.0f-samplex)*(sampley);
				value += orig[base_index+width*channels+channels]
							*(samplex)*(sampley);
				/*	move to the next channel	*/
				++base_index;
            	/*	save the new value	*/
            	resampled[y*resampled_width*channels+x*channels+c] =
						(unsigned char)(value);
            }
        }
    }
    /*	done	*/
    return 1;
}